

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  byte bVar1;
  short sVar2;
  ZSTD_literalCompressionMode_e ZVar3;
  uint *puVar4;
  ZSTD_entropyCTables_t *pZVar5;
  uint uVar6;
  undefined8 in_RAX;
  HUF_CElt *table;
  long lVar7;
  U32 UVar8;
  uint uVar9;
  long lVar10;
  uint lit;
  undefined8 uStack_18;
  
  ZVar3 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_18 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 0x401) {
      optPtr->priceType = zop_predef;
    }
    pZVar5 = optPtr->symbolCosts;
    if (pZVar5 == (ZSTD_entropyCTables_t *)0x0) {
      __assert_fail("optPtr->symbolCosts != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x460c,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if ((pZVar5->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (ZVar3 != ZSTD_lcm_uncompressed) {
        puVar4 = optPtr->litFreq;
        if (puVar4 == (uint *)0x0) {
          __assert_fail("optPtr->litFreq != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4613,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        optPtr->litSum = 0;
        lVar7 = 0;
        do {
          bVar1 = *(byte *)((long)(pZVar5->huf).CTable + lVar7 * 4 + 2);
          if (0xb < bVar1) {
            __assert_fail("bitCost <= scaleLog",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4618,
                          "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                         );
          }
          uVar9 = 1 << (0xb - bVar1 & 0x1f);
          if (bVar1 == 0) {
            uVar9 = 1;
          }
          puVar4[lVar7] = uVar9;
          optPtr->litSum = optPtr->litSum + uVar9;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x100);
      }
      sVar2 = (short)(pZVar5->fse).litlengthCTable[0];
      lVar7 = 1;
      if (sVar2 != 0) {
        lVar7 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      lVar10 = 0;
      do {
        uVar9 = (pZVar5->fse).litlengthCTable[lVar7 + lVar10 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar9) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4624,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar6 = 1 << (10U - (char)(uVar9 >> 0x10) & 0x1f);
        if (uVar9 < 0x10000) {
          uVar6 = 1;
        }
        optPtr->litLengthFreq[lVar10] = uVar6;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar6;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x24);
      sVar2 = (short)(pZVar5->fse).matchlengthCTable[0];
      lVar7 = 1;
      if (sVar2 != 0) {
        lVar7 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      lVar10 = 0;
      do {
        uVar9 = (pZVar5->fse).matchlengthCTable[lVar7 + lVar10 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar9) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4630,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar6 = 1 << (10U - (char)(uVar9 >> 0x10) & 0x1f);
        if (uVar9 < 0x10000) {
          uVar6 = 1;
        }
        optPtr->matchLengthFreq[lVar10] = uVar6;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar6;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x35);
      sVar2 = (short)(pZVar5->fse).offcodeCTable[0];
      lVar7 = 1;
      if (sVar2 != 0) {
        lVar7 = (long)(1 << ((char)sVar2 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      lVar10 = 0;
      do {
        uVar9 = (pZVar5->fse).offcodeCTable[lVar7 + lVar10 * 2 + 2] + 0xffff;
        if (0x9ffff < uVar9) {
          __assert_fail("bitCost < scaleLog",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x463c,
                        "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                       );
        }
        uVar6 = 1 << (10U - (char)(uVar9 >> 0x10) & 0x1f);
        if (uVar9 < 0x10000) {
          uVar6 = 1;
        }
        optPtr->offCodeFreq[lVar10] = uVar6;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar6;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x20);
      goto LAB_00174e0a;
    }
    if (optPtr->litFreq == (uint *)0x0) {
      __assert_fail("optPtr->litFreq != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4643,
                    "void ZSTD_rescaleFreqs(optState_t *const, const BYTE *const, const size_t, const int)"
                   );
    }
    if (ZVar3 != ZSTD_lcm_uncompressed) {
      uStack_18 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_18 + 4),src,srcSize);
      puVar4 = optPtr->litFreq;
      lVar7 = 0;
      UVar8 = 0;
      do {
        uVar9 = puVar4[lVar7] >> 5;
        puVar4[lVar7] = uVar9 + 1;
        UVar8 = UVar8 + uVar9 + 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x100);
      optPtr->litSum = UVar8;
    }
    puVar4 = optPtr->litLengthFreq;
    lVar7 = 0;
    do {
      puVar4[lVar7] = 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x24);
    optPtr->litLengthSum = 0x24;
    puVar4 = optPtr->matchLengthFreq;
    lVar7 = 0;
    do {
      puVar4[lVar7] = 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x35);
    optPtr->matchLengthSum = 0x35;
    puVar4 = optPtr->offCodeFreq;
    lVar7 = 0;
    do {
      puVar4[lVar7] = 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
    UVar8 = 0x20;
  }
  else {
    if (ZVar3 != ZSTD_lcm_uncompressed) {
      puVar4 = optPtr->litFreq;
      lVar7 = 0;
      UVar8 = 0;
      do {
        uVar9 = puVar4[lVar7] >> 5;
        puVar4[lVar7] = uVar9 + 1;
        UVar8 = UVar8 + uVar9 + 1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x100);
      optPtr->litSum = UVar8;
    }
    puVar4 = optPtr->litLengthFreq;
    lVar7 = 0;
    UVar8 = 0;
    do {
      uVar9 = puVar4[lVar7] >> 4;
      puVar4[lVar7] = uVar9 + 1;
      UVar8 = UVar8 + uVar9 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x24);
    optPtr->litLengthSum = UVar8;
    puVar4 = optPtr->matchLengthFreq;
    lVar7 = 0;
    UVar8 = 0;
    do {
      uVar9 = puVar4[lVar7] >> 4;
      puVar4[lVar7] = uVar9 + 1;
      UVar8 = UVar8 + uVar9 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x35);
    optPtr->matchLengthSum = UVar8;
    puVar4 = optPtr->offCodeFreq;
    lVar7 = 0;
    UVar8 = 0;
    do {
      uVar9 = puVar4[lVar7] >> 4;
      puVar4[lVar7] = uVar9 + 1;
      UVar8 = UVar8 + uVar9 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x20);
  }
  optPtr->offCodeSum = UVar8;
LAB_00174e0a:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* first block : init */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {  /* heuristic */
            DEBUGLOG(5, "(srcSize <= ZSTD_PREDEF_THRESHOLD) => zop_predef");
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {
            /* huffman table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBits(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* not a dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
            }

            {   unsigned ll;
                for (ll=0; ll<=MaxLL; ll++)
                    optPtr->litLengthFreq[ll] = 1;
            }
            optPtr->litLengthSum = MaxLL+1;

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned of;
                for (of=0; of<=MaxOff; of++)
                    optPtr->offCodeFreq[of] = 1;
            }
            optPtr->offCodeSum = MaxOff+1;

        }

    } else {   /* new block : re-use previous statistics, scaled down */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
        optPtr->litLengthSum = ZSTD_downscaleStat(optPtr->litLengthFreq, MaxLL, 0);
        optPtr->matchLengthSum = ZSTD_downscaleStat(optPtr->matchLengthFreq, MaxML, 0);
        optPtr->offCodeSum = ZSTD_downscaleStat(optPtr->offCodeFreq, MaxOff, 0);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}